

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deconvolutiondepthwise.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint64_t uVar9;
  undefined8 unaff_RBX;
  int kernel;
  long lVar10;
  uint_fast16_t uVar11;
  ulong uVar12;
  int *piVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  int bias;
  undefined8 uStack_38;
  bool bStack_31;
  
  auVar3 = _DAT_0016e020;
  auVar2 = _DAT_0016e010;
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar9 = 0x1007685db;
  lVar10 = 0;
  do {
    auVar15._8_4_ = (int)lVar10;
    auVar15._0_8_ = lVar10;
    auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar15 = (auVar15 | auVar2) ^ auVar3;
    if (auVar15._4_4_ == -0x80000000 && auVar15._0_4_ < -0x7fffffc1) {
      g_prng_rand_state.s[lVar10 + 1] = uVar9 - 0x7fffffff;
      g_prng_rand_state.s[lVar10 + 2] = uVar9;
    }
    lVar10 = lVar10 + 2;
    uVar9 = uVar9 + 0xfffffffe;
  } while (lVar10 != 0x40);
  lVar10 = 0;
  do {
    uVar11 = g_prng_rand_state.i;
    uVar12 = 0;
    do {
      iVar6 = (int)uVar11;
      iVar4 = (int)uVar12;
      uVar1 = uVar12 + 1;
      g_prng_rand_state.s[iVar6 + iVar4 & 0x3f] =
           g_prng_rand_state.s[iVar6 + iVar4 + 9U & 0x3f] +
           g_prng_rand_state.s[iVar6 + iVar4 + 0x28U & 0x3f];
      if (g_prng_rand_state.c != 0) break;
      bVar14 = uVar12 < 0x1ef;
      uVar12 = uVar1;
    } while (bVar14);
    bVar14 = g_prng_rand_state.c == 0;
    g_prng_rand_state.c = g_prng_rand_state.c - 1;
    if (bVar14) {
      g_prng_rand_state.c = 0x36;
    }
    lVar10 = lVar10 + 1;
    g_prng_rand_state.i = uVar11 + uVar1;
  } while (lVar10 != 10000);
  g_prng_rand_state.i = uVar11 + uVar1;
  iVar6 = 0;
  iVar4 = test_deconvolutiondepthwise(1,1,1,1,1,0,1,1,0x18b198,(int)unaff_RBX);
  iVar8 = -1;
  if (iVar4 == 0) {
    uStack_38 = 0x10000000018b198;
    piVar13 = (int *)(test_deconvolutiondepthwise_0()::kdsp + 0x1c);
    kernel = 1;
    iVar8 = 1;
    iVar4 = 1;
    uVar12 = 0;
    do {
      iVar7 = bias;
      iVar5 = test_deconvolutiondepthwise(2,2,iVar4,iVar8,kernel,iVar6,0,1,bias,(int)unaff_RBX);
      if (((((iVar5 != 0) ||
            (iVar5 = test_deconvolutiondepthwise
                               (2,2,iVar4,iVar8,kernel,iVar6,1,2,bias,(int)unaff_RBX), iVar5 != 0))
           || (iVar5 = test_deconvolutiondepthwise
                                 (3,3,iVar4,iVar8,kernel,iVar6,0,3,bias,(int)unaff_RBX), iVar5 != 0)
           ) || (((iVar5 = test_deconvolutiondepthwise
                                     (4,2,iVar4,iVar8,kernel,iVar6,1,2,bias,(int)unaff_RBX),
                  iVar5 != 0 ||
                  (iVar5 = test_deconvolutiondepthwise
                                     (4,4,iVar4,iVar8,kernel,iVar6,0,4,bias,(int)unaff_RBX),
                  iVar5 != 0)) ||
                 ((iVar5 = test_deconvolutiondepthwise
                                     (7,7,iVar4,iVar8,kernel,iVar6,1,7,bias,(int)unaff_RBX),
                  iVar5 != 0 ||
                  ((iVar5 = test_deconvolutiondepthwise
                                      (8,8,iVar4,iVar8,kernel,iVar6,0,2,bias,(int)unaff_RBX),
                   iVar5 != 0 ||
                   (iVar5 = test_deconvolutiondepthwise
                                      (8,8,iVar4,iVar8,kernel,iVar6,1,8,bias,(int)unaff_RBX),
                   iVar5 != 0)))))))) ||
         ((iVar5 = test_deconvolutiondepthwise
                             (0xc,0xc,iVar4,iVar8,kernel,iVar6,0,4,bias,(int)unaff_RBX), iVar5 != 0
          || ((((iVar5 = test_deconvolutiondepthwise
                                   (0xf,0xf,iVar4,iVar8,kernel,iVar6,1,0xf,bias,(int)unaff_RBX),
                iVar5 != 0 ||
                (iVar5 = test_deconvolutiondepthwise
                                   (0x10,8,iVar4,iVar8,kernel,iVar6,0,2,bias,(int)unaff_RBX),
                iVar5 != 0)) ||
               (iVar6 = test_deconvolutiondepthwise
                                  (0x10,0x10,iVar4,iVar8,kernel,iVar6,1,0x10,bias,(int)unaff_RBX),
               iVar6 != 0)) ||
              (uStack_38 = CONCAT17(uVar12 < 0xf,(undefined7)uStack_38), uVar12 == 0xf)))))) break;
      iVar4 = piVar13[-3];
      iVar8 = piVar13[-2];
      kernel = piVar13[-1];
      iVar6 = *piVar13;
      iVar7 = test_deconvolutiondepthwise(1,1,iVar4,iVar8,kernel,iVar6,1,1,iVar7,(int)unaff_RBX);
      piVar13 = piVar13 + 4;
      uVar12 = uVar12 + 1;
    } while (iVar7 == 0);
    iVar8 = -(uint)bStack_31;
  }
  return iVar8;
}

Assistant:

int main()
{
    SRAND(7767517);

    return test_deconvolutiondepthwise_0();
}